

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeDumper.cpp
# Opt level: O0

void Js::AsmJsByteCodeDumper::InitializeWAsmJsMemTag(ViewType type,WAsmJsMemTag *tag)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  WAsmJsMemTag *tag_local;
  ViewType type_local;
  
  switch(type) {
  case TYPE_INT8:
    tag->heapTag = L"HEAP8";
    tag->valueTag = L'I';
    break;
  case TYPE_UINT8:
    tag->heapTag = L"HEAPU8";
    tag->valueTag = L'U';
    break;
  case TYPE_INT16:
    tag->heapTag = L"HEAP16";
    tag->valueTag = L'I';
    break;
  case TYPE_UINT16:
    tag->heapTag = L"HEAPU16";
    tag->valueTag = L'U';
    break;
  case TYPE_INT32:
    tag->heapTag = L"HEAP32";
    tag->valueTag = L'I';
    break;
  case TYPE_UINT32:
    tag->heapTag = L"HEAPU32";
    tag->valueTag = L'U';
    break;
  case TYPE_FLOAT32:
    tag->heapTag = L"HEAPF32";
    tag->valueTag = L'F';
    break;
  case TYPE_FLOAT64:
    tag->heapTag = L"HEAPF64";
    tag->valueTag = L'D';
    break;
  case TYPE_INT64:
    tag->heapTag = L"HEAPI64";
    tag->valueTag = L'L';
    break;
  case TYPE_INT8_TO_INT64:
    tag->heapTag = L"HEAP8";
    tag->valueTag = L'L';
    break;
  case TYPE_UINT8_TO_INT64:
    tag->heapTag = L"HEAPU8";
    tag->valueTag = L'L';
    break;
  case TYPE_INT16_TO_INT64:
    tag->heapTag = L"HEAP16";
    tag->valueTag = L'L';
    break;
  case TYPE_UINT16_TO_INT64:
    tag->heapTag = L"HEAPU16";
    tag->valueTag = L'L';
    break;
  case TYPE_INT32_TO_INT64:
    tag->heapTag = L"HEAP32";
    tag->valueTag = L'L';
    break;
  case TYPE_UINT32_TO_INT64:
    tag->heapTag = L"HEAPU32";
    tag->valueTag = L'L';
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/AsmJsByteCodeDumper.cpp"
                                ,0x227,"((0))","(0)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return;
}

Assistant:

void AsmJsByteCodeDumper::InitializeWAsmJsMemTag(ArrayBufferView::ViewType type, _Out_ WAsmJsMemTag * tag)
    {
        switch (type)
        {
        case ArrayBufferView::TYPE_INT8:
            tag->heapTag = _u("HEAP8"); tag->valueTag = 'I';  break;
        case ArrayBufferView::TYPE_UINT8:
            tag->heapTag = _u("HEAPU8"); tag->valueTag = 'U'; break;
        case ArrayBufferView::TYPE_INT16:
            tag->heapTag = _u("HEAP16"); tag->valueTag = 'I'; break;
        case ArrayBufferView::TYPE_UINT16:
            tag->heapTag = _u("HEAPU16"); tag->valueTag = 'U'; break;
        case ArrayBufferView::TYPE_INT32:
            tag->heapTag = _u("HEAP32"); tag->valueTag = 'I'; break;
        case ArrayBufferView::TYPE_UINT32:
            tag->heapTag = _u("HEAPU32"); tag->valueTag = 'U'; break;
        case ArrayBufferView::TYPE_FLOAT32:
            tag->heapTag = _u("HEAPF32"); tag->valueTag = 'F'; break;
        case ArrayBufferView::TYPE_FLOAT64:
            tag->heapTag = _u("HEAPF64"); tag->valueTag = 'D'; break;
        case ArrayBufferView::TYPE_INT64:
            tag->heapTag = _u("HEAPI64"); tag->valueTag = 'L'; break;
        case ArrayBufferView::TYPE_INT8_TO_INT64:
            tag->heapTag = _u("HEAP8"); tag->valueTag = 'L'; break;
        case ArrayBufferView::TYPE_UINT8_TO_INT64:
            tag->heapTag = _u("HEAPU8"); tag->valueTag = 'L'; break;
        case ArrayBufferView::TYPE_INT16_TO_INT64:
            tag->heapTag = _u("HEAP16"); tag->valueTag = 'L'; break;
        case ArrayBufferView::TYPE_UINT16_TO_INT64:
            tag->heapTag = _u("HEAPU16"); tag->valueTag = 'L'; break;
        case ArrayBufferView::TYPE_INT32_TO_INT64:
            tag->heapTag = _u("HEAP32"); tag->valueTag = 'L'; break;
        case ArrayBufferView::TYPE_UINT32_TO_INT64:
            tag->heapTag = _u("HEAPU32"); tag->valueTag = 'L'; break;
        default:
            Assume(UNREACHED);
        }
    }